

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O3

uchar * rans_uncompress_O0(uchar *in,uint in_size,uint *out_size)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  uchar *puVar8;
  void *__ptr;
  uchar *puVar9;
  uint uVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  RansDecSymbol syms [256];
  uint local_460;
  ushort auStack_438 [516];
  
  if ((*in != '\0') || (*(int *)(in + 1) != in_size - 9)) {
    return (uchar *)0x0;
  }
  bVar2 = in[5];
  uVar13 = (long)(int)((uint)*(ushort *)(in + 7) << 0x10) | (ulong)in[6] << 8 | (ulong)bVar2;
  puVar8 = (uchar *)malloc(uVar13);
  uVar10 = 0;
  if (puVar8 == (uchar *)0x0) {
    return (uchar *)0x0;
  }
  uVar17 = (uint)in[9];
  puVar16 = (uint *)(in + 10);
  __ptr = (void *)0x0;
  uVar19 = 0;
  do {
    bVar3 = (byte)*puVar16;
    uVar18 = (uint)bVar3;
    if ((char)bVar3 < '\0') {
      pbVar1 = (byte *)((long)puVar16 + 1);
      puVar16 = (uint *)((long)puVar16 + 2);
      uVar18 = (bVar3 & 0x7f) << 8 | (uint)*pbVar1;
    }
    else {
      puVar16 = (uint *)((long)puVar16 + 1);
    }
    if (0x10000 < uVar19) {
      __assert_fail("start <= (1 << 16)",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                    ,0x103,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
    }
    if (0x10000 - uVar19 < uVar18) {
      __assert_fail("freq <= (1 << 16) - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                    ,0x104,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
    }
    auStack_438[(long)(int)uVar17 * 2] = (ushort)uVar19;
    auStack_438[(long)(int)uVar17 * 2 + 1] = (ushort)uVar18;
    if (__ptr == (void *)0x0) {
      __ptr = malloc(0x1000);
    }
    memset((void *)((ulong)uVar19 + (long)__ptr),uVar17,(ulong)uVar18);
    if (uVar10 == 0) {
      uVar15 = *puVar16;
      if (uVar17 + 1 == (uint)(byte)uVar15) {
        uVar10 = (uint)*(byte *)((long)puVar16 + 1);
        puVar16 = (uint *)((long)puVar16 + 2);
        goto LAB_00135c65;
      }
      puVar16 = (uint *)((long)puVar16 + 1);
      uVar10 = 0;
      uVar17 = (uint)(byte)uVar15;
    }
    else {
      uVar10 = uVar10 - 1;
LAB_00135c65:
      uVar17 = uVar17 + 1;
    }
    uVar19 = uVar18 + uVar19;
  } while (uVar17 != 0);
  if (0xfff < uVar19) {
    __assert_fail("x < TOTFREQ",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                  ,0x102,
                  "unsigned char *rans_uncompress_O0(unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  uVar10 = *puVar16;
  uVar17 = puVar16[1];
  uVar19 = puVar16[2];
  puVar11 = puVar16 + 4;
  local_460 = (uint)uVar13;
  uVar13 = (long)(int)local_460 & 0xfffffffffffffffc;
  uVar18 = (uint)uVar13;
  if (0 < (int)uVar18) {
    uVar15 = puVar16[3];
    uVar14 = 0;
    do {
      bVar3 = *(byte *)((long)__ptr + (ulong)(uVar10 & 0xfff));
      bVar4 = *(byte *)((long)__ptr + (ulong)(uVar17 & 0xfff));
      bVar5 = *(byte *)((long)__ptr + (ulong)(uVar19 & 0xfff));
      uVar7 = auStack_438[(ulong)bVar3 * 2 + 1];
      bVar6 = *(byte *)((long)__ptr + (ulong)(uVar15 & 0xfff));
      puVar8[uVar14] = bVar3;
      uVar10 = ((uVar10 & 0xfff) - (uint)auStack_438[(ulong)bVar3 * 2]) +
               (uVar10 >> 0xc) * (uint)uVar7;
      puVar8[uVar14 + 1] = bVar4;
      puVar8[uVar14 + 2] = bVar5;
      puVar8[uVar14 + 3] = bVar6;
      uVar12 = uVar10;
      if (uVar10 < 0x800000) {
        do {
          uVar10 = *puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
          uVar10 = (uint)(byte)uVar10 | uVar12 << 8;
          bVar20 = uVar12 < 0x8000;
          uVar12 = uVar10;
        } while (bVar20);
      }
      uVar17 = ((uVar17 & 0xfff) - (uint)auStack_438[(ulong)bVar4 * 2]) +
               (uVar17 >> 0xc) * (uint)auStack_438[(ulong)bVar4 * 2 + 1];
      uVar12 = uVar17;
      if (uVar17 < 0x800000) {
        do {
          uVar17 = *puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
          uVar17 = (uint)(byte)uVar17 | uVar12 << 8;
          bVar20 = uVar12 < 0x8000;
          uVar12 = uVar17;
        } while (bVar20);
      }
      uVar19 = ((uVar19 & 0xfff) - (uint)auStack_438[(ulong)bVar5 * 2]) +
               (uVar19 >> 0xc) * (uint)auStack_438[(ulong)bVar5 * 2 + 1];
      uVar12 = uVar19;
      if (uVar19 < 0x800000) {
        do {
          uVar19 = *puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
          uVar19 = (uint)(byte)uVar19 | uVar12 << 8;
          bVar20 = uVar12 < 0x8000;
          uVar12 = uVar19;
        } while (bVar20);
      }
      uVar15 = ((uVar15 & 0xfff) - (uint)auStack_438[(ulong)bVar6 * 2]) +
               (uVar15 >> 0xc) * (uint)auStack_438[(ulong)bVar6 * 2 + 1];
      uVar12 = uVar15;
      if (uVar15 < 0x800000) {
        do {
          uVar15 = *puVar11;
          puVar11 = (uint *)((long)puVar11 + 1);
          uVar15 = (uint)(byte)uVar15 | uVar12 << 8;
          bVar20 = uVar12 < 0x8000;
          uVar12 = uVar15;
        } while (bVar20);
      }
      uVar14 = uVar14 + 4;
    } while (uVar14 < ((long)(int)local_460 & 0xfffffffcU));
  }
  switch(bVar2 & 3) {
  case 0:
    *out_size = local_460;
    if (__ptr == (void *)0x0) {
      return puVar8;
    }
    goto LAB_00135f33;
  case 1:
    puVar9 = (uchar *)((ulong)(uVar10 & 0xfff) + (long)__ptr);
    break;
  case 2:
    puVar8[uVar13] = *(uchar *)((long)__ptr + (ulong)(uVar10 & 0xfff));
    puVar9 = (uchar *)((ulong)(uVar17 & 0xfff) + (long)__ptr);
    uVar18 = uVar18 | 1;
    break;
  case 3:
    bVar2 = *(byte *)((long)__ptr + (ulong)(uVar10 & 0xfff));
    uVar10 = ((uVar10 & 0xfff) - (uint)auStack_438[(ulong)bVar2 * 2]) +
             (uVar10 >> 0xc) * (uint)auStack_438[(ulong)bVar2 * 2 + 1];
    if (uVar10 < 0x800000) {
      do {
        uVar15 = *puVar11;
        puVar11 = (uint *)((long)puVar11 + 1);
        bVar20 = uVar10 < 0x8000;
        uVar10 = (uint)(byte)uVar15 | uVar10 << 8;
      } while (bVar20);
    }
    puVar8[(int)uVar18] = bVar2;
    puVar8[(long)(int)uVar18 + 1] = *(uchar *)((long)__ptr + (ulong)(uVar17 & 0xfff));
    puVar9 = (uchar *)((ulong)(uVar19 & 0xfff) + (long)__ptr);
    uVar18 = uVar18 | 2;
  }
  puVar8[(int)uVar18] = *puVar9;
  *out_size = local_460;
LAB_00135f33:
  free(__ptr);
  return puVar8;
}

Assistant:

unsigned char *rans_uncompress_O0(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j, x, out_sz, in_sz, rle;
    char *out_buf;
    ari_decoder D;
    RansDecSymbol syms[256];

    memset(&D, 0, sizeof(D));

    if (*in++ != 0) // Order-0 check
	return NULL;
    
    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    // Precompute reverse lookup of frequency.
    rle = x = 0;
    j = *cp++;
    do {
	if ((D.fc[j].F = *cp++) >= 128) {
	    D.fc[j].F &= ~128;
	    D.fc[j].F = ((D.fc[j].F & 127) << 8) | *cp++;
	}
	D.fc[j].C = x;

	RansDecSymbolInit(&syms[j], D.fc[j].C, D.fc[j].F);

	/* Build reverse lookup table */
	if (!D.R) D.R = (unsigned char *)malloc(TOTFREQ);
	memset(&D.R[x], j, D.fc[j].F);

	x += D.fc[j].F;

	if (!rle && j+1 == *cp) {
	    j = *cp++;
	    rle = *cp++;
	} else if (rle) {
	    rle--;
	    j++;
	} else {
	    j = *cp++;
	}
    } while(j);

    assert(x < TOTFREQ);

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int out_end = (out_sz&~3);

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;
    uint32_t mask = (1u << TF_SHIFT)-1;

    for (i=0; i < out_end; i+=4) {
	uint32_t m[4] = {R[0] & mask,
			 R[1] & mask,
			 R[2] & mask,
			 R[3] & mask};
	uint8_t c[4] = {D.R[m[0]],
			D.R[m[1]],
			D.R[m[2]],
			D.R[m[3]]};
	out_buf[i+0] = c[0];
	out_buf[i+1] = c[1];
	out_buf[i+2] = c[2];
	out_buf[i+3] = c[3];

	// RansDecAdvanceSymbolStep(&R[0], &syms[c[0]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[1], &syms[c[1]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[2], &syms[c[2]], TF_SHIFT);
	// RansDecAdvanceSymbolStep(&R[3], &syms[c[3]], TF_SHIFT);
	R[0] = syms[c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[c[0]].start;
	R[1] += m[1] - syms[c[1]].start;
	R[2] += m[2] - syms[c[2]].start;
	R[3] += m[3] - syms[c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    switch(out_sz&3) {
	unsigned char c;
    case 0:
	break;
    case 1:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;
	break;

    case 2:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;
	break;

    case 3:
	c = D.R[RansDecGet(&rans0, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans0, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end] = c;

	c = D.R[RansDecGet(&rans1, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans1, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+1] = c;

	c = D.R[RansDecGet(&rans2, TF_SHIFT)];
	RansDecAdvanceSymbol(&rans2, &ptr, &syms[c], TF_SHIFT);
	out_buf[out_end+2] = c;
	break;
    }

    *out_size = out_sz;

    if (D.R) free(D.R);

    return (unsigned char *)out_buf;
}